

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasSlCrank_dns.c
# Opt level: O0

void PrintOutput(void *mem,sunrealtype t,N_Vector y)

{
  undefined4 uVar1;
  undefined8 *puVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  sunrealtype hused;
  long nst;
  int kused;
  int retval;
  sunrealtype *yval;
  undefined4 local_38;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  
  puVar2 = (undefined8 *)N_VGetArrayPointer(in_RSI);
  uVar1 = IDAGetLastOrder(in_RDI,&stack0xffffffffffffffd8);
  check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc);
  uVar1 = IDAGetNumSteps(in_RDI,&stack0xffffffffffffffd0);
  check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc);
  uVar1 = IDAGetLastStep(in_RDI,&local_38);
  check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc);
  printf("%5.2f %12.4e %12.4e %12.4e | %3ld  %1d %12.4e\n",in_XMM0_Qa,*puVar2,puVar2[1],puVar2[2],
         CONCAT44(in_stack_ffffffffffffffcc,local_38),in_stack_ffffffffffffffd0,
         (ulong)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void PrintOutput(void* mem, sunrealtype t, N_Vector y)
{
  sunrealtype* yval;
  int retval, kused;
  long int nst;
  sunrealtype hused;

  yval = N_VGetArrayPointer(y);

  retval = IDAGetLastOrder(mem, &kused);
  check_retval(&retval, "IDAGetLastOrder", 1);
  retval = IDAGetNumSteps(mem, &nst);
  check_retval(&retval, "IDAGetNumSteps", 1);
  retval = IDAGetLastStep(mem, &hused);
  check_retval(&retval, "IDAGetLastStep", 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%5.2Lf %12.4Le %12.4Le %12.4Le | %3ld  %1d %12.4Le\n", t, yval[0],
         yval[1], yval[2], nst, kused, hused);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%5.2f %12.4e %12.4e %12.4e | %3ld  %1d %12.4e\n", t, yval[0], yval[1],
         yval[2], nst, kused, hused);
#else
  printf("%5.2f %12.4e %12.4e %12.4e | %3ld  %1d %12.4e\n", t, yval[0], yval[1],
         yval[2], nst, kused, hused);
#endif
}